

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void SldTrackComments(void)

{
  bool bVar1;
  reference pbVar2;
  char *__needle;
  char *pcVar3;
  int local_6c;
  bool local_59;
  int local_44;
  string local_40 [4];
  int pageNum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  
  local_59 = false;
  if (eolComment != (char *)0x0) {
    local_59 = IsSldExportActive();
  }
  if (local_59 == false) {
    __assert_fail("eolComment && IsSldExportActive()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                  ,0x5cc,"void SldTrackComments()");
  }
  if (*eolComment != '\0') {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&sldCommentKeywords_abi_cxx11_);
    keyword.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&sldCommentKeywords_abi_cxx11_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&keyword.field_2 + 8)), bVar1) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string(local_40,(string *)pbVar2);
      pcVar3 = eolComment;
      __needle = (char *)std::__cxx11::string::c_str();
      pcVar3 = strstr(pcVar3,__needle);
      if (pcVar3 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        local_44 = Page->Number;
        if (PseudoORG != DISP_NONE) {
          if (dispPageNum == -1) {
            local_6c = CDevice::GetPageOfA16(Device,CurAddress);
          }
          else {
            local_6c = dispPageNum;
          }
          local_44 = local_6c;
        }
        WriteToSldFile(local_44,CurAddress,'K',eolComment);
        bVar1 = true;
      }
      std::__cxx11::string::~string(local_40);
      if (bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void SldTrackComments() {
	assert(eolComment && IsSldExportActive());
	if (!eolComment[0]) return;
	for (auto keyword : sldCommentKeywords) {
		if (strstr(eolComment, keyword.c_str())) {
			int pageNum = Page->Number;
			if (DISP_NONE != PseudoORG) {
				pageNum = LABEL_PAGE_UNDEFINED != dispPageNum ? dispPageNum : Device->GetPageOfA16(CurAddress);
			}
			WriteToSldFile(pageNum, CurAddress, 'K', eolComment);
			return;
		}
	}
}